

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O0

RK_S32 vpu_api_control(VpuCodecContext *ctx,VPU_API_CMD cmdType,void *param)

{
  VpuApiLegacy *this;
  vpu_display_mem_pool_impl *p_mempool;
  VpuApiLegacy *api;
  void *param_local;
  VPU_API_CMD cmdType_local;
  VpuCodecContext *ctx_local;
  
  if (ctx == (VpuCodecContext *)0x0) {
    _mpp_log_l(4,"vpu_api","vpu_api_decode fail, input invalid",0);
    ctx_local._4_4_ = -1;
  }
  else {
    this = (VpuApiLegacy *)ctx->vpuApiObj;
    if (this == (VpuApiLegacy *)0x0) {
      _mpp_log_l(4,"vpu_api","vpu_api_decode fail, vpu api invalid",0);
      ctx_local._4_4_ = -1;
    }
    else {
      if ((vpu_api_debug & 1) != 0) {
        _mpp_log_l(4,"vpu_api","enter\n","vpu_api_control");
      }
      api = (VpuApiLegacy *)param;
      if (cmdType == VPU_API_SET_VPUMEM_CONTEXT) {
        api = *(VpuApiLegacy **)((long)param + 0x80);
      }
      if ((vpu_api_debug & 1) != 0) {
        _mpp_log_l(4,"vpu_api","pass to mpi\n","vpu_api_control");
      }
      ctx_local._4_4_ = VpuApiLegacy::control(this,ctx,cmdType,api);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32
vpu_api_control(VpuCodecContext *ctx, VPU_API_CMD cmdType, void *param)
{
    if (ctx == NULL) {
        mpp_log("vpu_api_decode fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }

    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_decode fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    vpu_api_dbg_func("enter\n");
    switch (cmdType) {
    case VPU_API_SET_VPUMEM_CONTEXT: {
        vpu_display_mem_pool_impl *p_mempool =
            (vpu_display_mem_pool_impl *)param;

        param = (void*)p_mempool->group;
        break;
    }
    default: {
        break;
    }
    }

    vpu_api_dbg_func("pass to mpi\n");
    return api->control(ctx, cmdType, param);
}